

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O3

void __thiscall
hnsw::HNSWIndex::HNSWIndex
          (HNSWIndex *this,float *data,uint32_t n_points,uint32_t dim,Distance *distance,int M,
          int ef_construction)

{
  param_type pVar1;
  ulong n_rows;
  double dVar2;
  
  n_rows = (ulong)n_points;
  (this->super_Index)._vptr_Index = (_func_int **)&PTR_Build_0010bd70;
  *(undefined8 *)&this->top_layer_ = 0;
  *(undefined8 *)
   ((long)&(this->vertices_).
           super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vertices_).
           super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vertices_).
           super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->visited_).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->visited_).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->visited_).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->visited_).m_num_bits = 0;
  pVar1 = (param_type)vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  (this->generator_)._M_x = 1;
  (this->distribution_)._M_param = pVar1;
  Matrix::Matrix(&this->points_,data,n_rows,(ulong)dim);
  this->num_points_ = 0;
  this->distance_ = distance;
  this->top_layer_ = 0;
  this->M_ = M;
  this->maxM_ = M;
  this->maxM0_ = M * 2;
  dVar2 = log((double)M);
  if (M < ef_construction) {
    M = ef_construction;
  }
  this->ml_ = 1.0 / dVar2;
  this->ef_search_ = 0;
  this->ef_construction_ = M;
  this->dim_ = dim;
  std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::resize
            (&this->vertices_,n_rows);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->visited_,n_rows,false);
  return;
}

Assistant:

HNSWIndex(float *data,
            uint32_t n_points,
            uint32_t dim,
            const Distance &distance,
            int M,
            int ef_construction)
      : points_(data, n_points, dim), distance_(distance) {
    top_layer_ = 0;
    M_ = M;
    maxM_ = M;
    maxM0_ = 2 * M;
    ml_ = 1 / log(1.0 * M);
    ef_search_ = 0;
    ef_construction_ = std::max(ef_construction, M);
    dim_ = dim;

    vertices_.resize(n_points);
    visited_.resize(n_points);
  }